

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

uint Gia_ManRandom(int fReset)

{
  if (fReset != 0) {
    Gia_ManRandom::m_z = 0xdd8c5109;
    Gia_ManRandom::m_w = 0x81962ff0;
  }
  Gia_ManRandom::m_z = (Gia_ManRandom::m_z >> 0x10) + (Gia_ManRandom::m_z & 0xffff) * 0x9069;
  Gia_ManRandom::m_w = (Gia_ManRandom::m_w >> 0x10) + (Gia_ManRandom::m_w & 0xffff) * 18000;
  return Gia_ManRandom::m_z * 0x10000 + Gia_ManRandom::m_w;
}

Assistant:

unsigned Gia_ManRandom( int fReset )
{
    static unsigned int m_z = NUMBER1;
    static unsigned int m_w = NUMBER2;
    if ( fReset )
    {
        m_z = NUMBER1;
        m_w = NUMBER2;
    }
    m_z = 36969 * (m_z & 65535) + (m_z >> 16);
    m_w = 18000 * (m_w & 65535) + (m_w >> 16);
    return (m_z << 16) + m_w;
}